

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall
QGraphicsViewPrivate::mouseMoveEventHandler(QGraphicsViewPrivate *this,QMouseEvent *event)

{
  QEventStorage<QMouseEvent> *this_00;
  QGraphicsView *this_01;
  Data *pDVar1;
  long lVar2;
  long lVar3;
  QGraphicsItem *this_02;
  QGraphicsScenePrivate *this_03;
  bool bVar4;
  MouseEventSource source;
  MouseEventFlags flags;
  QFlagsStorage<Qt::MouseButton> QVar5;
  QPoint QVar6;
  QWidget *widget;
  QObject *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  double dVar11;
  double in_XMM1_Qa;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> QVar12;
  QPointF QVar13;
  QPointF local_78;
  QPoint local_68;
  QPointF local_60;
  undefined1 local_48 [12];
  char cStack_3c;
  undefined3 uStack_3b;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  updateRubberBand(this,event);
  this->field_0x300 = this->field_0x300 | 8;
  this_00 = &this->lastMouseEvent;
  if ((this_00 != (QEventStorage<QMouseEvent> *)event) ||
     ((this->lastMouseEvent).m_engaged == false)) {
    QEventStorage<QMouseEvent>::store(this_00,event);
  }
  (**(code **)(*(long *)&(this->lastMouseEvent).field_0 + 0x10))(this_00,0);
  if (((((*(uint *)&this->field_0x300 & 0x201) != 1) ||
       (pDVar1 = (this->scene).wp.d, pDVar1 == (Data *)0x0)) || (*(int *)(pDVar1 + 4) == 0)) ||
     ((this->scene).wp.value == (QObject *)0x0)) goto LAB_0063c6e6;
  local_38.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
            ((QGraphicsSceneMouseEvent *)local_48,GraphicsSceneMouseMove);
  QGraphicsSceneEvent::setWidget
            ((QGraphicsSceneEvent *)local_48,(this->super_QAbstractScrollAreaPrivate).viewport);
  QGraphicsSceneMouseEvent::setButtonDownScenePos
            ((QGraphicsSceneMouseEvent *)local_48,this->mousePressButton,&this->mousePressScenePoint
            );
  QGraphicsSceneMouseEvent::setButtonDownScreenPos
            ((QGraphicsSceneMouseEvent *)local_48,this->mousePressButton,
             &this->mousePressScreenPoint);
  dVar9 = (double)QEventPoint::position();
  dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
  dVar10 = 2147483647.0;
  if (dVar9 <= 2147483647.0) {
    dVar10 = dVar9;
  }
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  in_XMM1_Qa = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa;
  dVar9 = 2147483647.0;
  if (in_XMM1_Qa <= 2147483647.0) {
    dVar9 = in_XMM1_Qa;
  }
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  local_78.xp._4_4_ = (int)dVar9;
  local_78.xp._0_4_ = (int)dVar10;
  local_60 = QGraphicsView::mapToScene(this_01,(QPoint *)&local_78);
  QVar12.d = (QGraphicsItemPrivate *)local_60.yp;
  QGraphicsSceneMouseEvent::setScenePos((QGraphicsSceneMouseEvent *)local_48,&local_60);
  dVar9 = (double)QEventPoint::globalPosition();
  QVar13 = local_60;
  dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
  dVar10 = 2147483647.0;
  if (dVar9 <= 2147483647.0) {
    dVar10 = dVar9;
  }
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  dVar11 = (double)((ulong)QVar12.d & 0x8000000000000000 | 0x3fe0000000000000) + (double)QVar12.d;
  dVar9 = 2147483647.0;
  if (dVar11 <= 2147483647.0) {
    dVar9 = dVar11;
  }
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  local_60.xp._4_4_ = (int)dVar9;
  local_60.xp._0_4_ = (int)dVar10;
  local_60.yp = QVar13.yp;
  QGraphicsSceneMouseEvent::setScreenPos((QGraphicsSceneMouseEvent *)local_48,(QPoint *)&local_60);
  QGraphicsSceneMouseEvent::setLastScenePos
            ((QGraphicsSceneMouseEvent *)local_48,&this->lastMouseMoveScenePoint);
  QGraphicsSceneMouseEvent::setLastScreenPos
            ((QGraphicsSceneMouseEvent *)local_48,&this->lastMouseMoveScreenPoint);
  QGraphicsSceneMouseEvent::setButtons
            ((QGraphicsSceneMouseEvent *)local_48,
             (QFlagsStorageHelper<Qt::MouseButton,_4>)
             *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
  QGraphicsSceneMouseEvent::setButton
            ((QGraphicsSceneMouseEvent *)local_48,*(MouseButton *)(event + 0x40));
  QGraphicsSceneMouseEvent::setModifiers
            ((QGraphicsSceneMouseEvent *)local_48,
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
             *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
  source = QMouseEvent::source();
  QGraphicsSceneMouseEvent::setSource((QGraphicsSceneMouseEvent *)local_48,source);
  flags.super_QFlagsStorageHelper<Qt::MouseEventFlag,_4>.super_QFlagsStorage<Qt::MouseEventFlag>.i =
       (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)QMouseEvent::flags();
  QGraphicsSceneMouseEvent::setFlags((QGraphicsSceneMouseEvent *)local_48,flags);
  QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_48,*(quint64 *)(event + 0x18));
  QVar13 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)local_48);
  this->lastMouseMoveScenePoint = QVar13;
  QVar6 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)local_48);
  this->lastMouseMoveScreenPoint = QVar6;
  cStack_3c = 0;
  pDVar1 = (this->scene).wp.d;
  if (event[0xb] == (QMouseEvent)0x1) {
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar7 = (QObject *)0x0;
    }
    else {
      pQVar7 = (this->scene).wp.value;
    }
    qt_sendSpontaneousEvent(pQVar7,(QEvent *)local_48);
  }
  else {
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar7 = (QObject *)0x0;
    }
    else {
      pQVar7 = (this->scene).wp.value;
    }
    QCoreApplication::sendEvent(pQVar7,(QEvent *)local_48);
  }
  (**(code **)(*(long *)&this_00->field_0 + 0x10))(this_00,cStack_3c);
  if (cStack_3c == '\x01') {
    QVar5.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)local_48);
    if ((QFlagsStorage<Qt::MouseButton>)QVar5.i == (QFlagsStorage<Qt::MouseButton>)0x0)
    goto LAB_0063c5ec;
  }
  else {
LAB_0063c5ec:
    if ((((*(byte *)(*(long *)((this->scene).wp.value + 8) + 0xb9) & 0x10) != 0) &&
        ((*(byte *)(*(long *)((this->scene).wp.value + 8) + 0xb9) & 0x20) == 0)) &&
       (*(long *)(*(long *)((this->scene).wp.value + 8) + 0x238) == 0)) {
      this_03 = *(QGraphicsScenePrivate **)((this->scene).wp.value + 8);
      local_68 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)local_48);
      local_78 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)local_48);
      widget = QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)local_48);
      QGraphicsScenePrivate::itemsAtPosition
                ((QList<QGraphicsItem_*> *)&local_60,this_03,&local_68,&local_78,widget);
      QArrayDataPointer<QGraphicsItem_*>::operator=
                ((QArrayDataPointer<QGraphicsItem_*> *)
                 (*(long *)((this->scene).wp.value + 8) + 0x228),
                 (QArrayDataPointer<QGraphicsItem_*> *)&local_60);
      if ((QArrayData *)local_60.xp != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_60.xp)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_60.xp)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_60.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_60.xp,8,0x10);
        }
      }
    }
    lVar2 = *(long *)((this->scene).wp.value + 8);
    lVar3 = *(long *)(lVar2 + 0x238);
    if (lVar3 != 0) {
      lVar2 = *(long *)(lVar2 + 0x230);
      lVar8 = 0;
      do {
        this_02 = *(QGraphicsItem **)(lVar2 + lVar8);
        bVar4 = QGraphicsItem::isEnabled(this_02);
        if (bVar4) {
          bVar4 = QGraphicsItem::hasCursor(this_02);
          if (bVar4) {
            QGraphicsItem::cursor((QGraphicsItem *)&local_60);
            _q_setViewportCursor(this,(QCursor *)&local_60);
            QCursor::~QCursor((QCursor *)&local_60);
            goto LAB_0063c6dc;
          }
        }
        lVar8 = lVar8 + 8;
      } while (lVar3 << 3 != lVar8);
    }
    if (this->hasStoredOriginalCursor == true) {
      this->hasStoredOriginalCursor = false;
      QWidget::setCursor((this->super_QAbstractScrollAreaPrivate).viewport,&this->originalCursor);
    }
  }
LAB_0063c6dc:
  QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_48);
LAB_0063c6e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::mouseMoveEventHandler(QMouseEvent *event)
{
    Q_Q(QGraphicsView);

#if QT_CONFIG(rubberband)
    updateRubberBand(event);
#endif

    storeMouseEvent(event);
    lastMouseEvent->setAccepted(false);

    if (!sceneInteractionAllowed)
        return;
    if (handScrolling)
        return;
    if (!scene)
        return;

    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseMove);
    mouseEvent.setWidget(viewport);
    mouseEvent.setButtonDownScenePos(mousePressButton, mousePressScenePoint);
    mouseEvent.setButtonDownScreenPos(mousePressButton, mousePressScreenPoint);
    mouseEvent.setScenePos(q->mapToScene(event->position().toPoint()));
    mouseEvent.setScreenPos(event->globalPosition().toPoint());
    mouseEvent.setLastScenePos(lastMouseMoveScenePoint);
    mouseEvent.setLastScreenPos(lastMouseMoveScreenPoint);
    mouseEvent.setButtons(event->buttons());
    mouseEvent.setButton(event->button());
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setSource(event->source());
    mouseEvent.setFlags(event->flags());
    mouseEvent.setTimestamp(event->timestamp());
    lastMouseMoveScenePoint = mouseEvent.scenePos();
    lastMouseMoveScreenPoint = mouseEvent.screenPos();
    mouseEvent.setAccepted(false);
    if (event->spontaneous())
        qt_sendSpontaneousEvent(scene, &mouseEvent);
    else
        QCoreApplication::sendEvent(scene, &mouseEvent);

    // Remember whether the last event was accepted or not.
    lastMouseEvent->setAccepted(mouseEvent.isAccepted());

    if (mouseEvent.isAccepted() && mouseEvent.buttons() != 0) {
        // The event was delivered to a mouse grabber; the press is likely to
        // have set a cursor, and we must not change it.
        return;
    }

#ifndef QT_NO_CURSOR
    // If all the items ignore hover events, we don't look-up any items
    // in QGraphicsScenePrivate::dispatchHoverEvent, hence the
    // cachedItemsUnderMouse list will be empty. We therefore do the look-up
    // for cursor items here if not all items use the default cursor.
    if (scene->d_func()->allItemsIgnoreHoverEvents && !scene->d_func()->allItemsUseDefaultCursor
        && scene->d_func()->cachedItemsUnderMouse.isEmpty()) {
        scene->d_func()->cachedItemsUnderMouse = scene->d_func()->itemsAtPosition(mouseEvent.screenPos(),
                                                                                  mouseEvent.scenePos(),
                                                                                  mouseEvent.widget());
    }
    // Find the topmost item under the mouse with a cursor.
    for (QGraphicsItem *item : std::as_const(scene->d_func()->cachedItemsUnderMouse)) {
        if (item->isEnabled() && item->hasCursor()) {
            _q_setViewportCursor(item->cursor());
            return;
        }
    }

    // No items with cursors found; revert to the view cursor.
    if (hasStoredOriginalCursor) {
        // Restore the original viewport cursor.
        hasStoredOriginalCursor = false;
        viewport->setCursor(originalCursor);
    }
#endif
}